

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canal.cc
# Opt level: O1

void search<OffsetFreeSymbolMatcher,unsigned_long>
               (csptr *view,OffsetFreeSymbolMatcher *m,Addr loc,AddressRanges *searchaddrs,
               SymbolStore *store,bool showaddrs)

{
  pointer ppVar1;
  ulong uVar2;
  unsigned_long *puVar3;
  ostream *poVar4;
  size_t sVar5;
  pair<unsigned_long,_unsigned_long> *range;
  pointer ppVar6;
  ReaderArray<unsigned_long,_131072UL> r;
  IOFlagSave _;
  char local_50;
  AddressRanges *__range4;
  
  pstack::IOFlagSave::IOFlagSave
            ((IOFlagSave *)(r.cache._M_elems + 0x1ffff),
             (ios *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  pstack::ReaderArray<unsigned_long,_131072UL>::ReaderArray
            ((ReaderArray<unsigned_long,_131072UL> *)&stack0xffffffffffeffe70,
             (view->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,0);
  if ((searchaddrs->
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (searchaddrs->
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    if (r.cacheEnd != 0) {
      sVar5 = 0;
      do {
        puVar3 = pstack::ReaderArray<unsigned_long,_131072UL>::getitem
                           ((ReaderArray<unsigned_long,_131072UL> *)&stack0xffffffffffeffe70,sVar5);
        SymbolStore::find<OffsetFreeSymbolMatcher>((SymbolStore *)&_.field_0x108,store,*puVar3);
        if (local_50 == '\x01') {
          if (showaddrs) {
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,*(char **)(_._264_8_ + 0x20),
                                *(long *)(_._264_8_ + 0x28));
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," 0x",3);
            *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
                 *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
                 *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ... size=",10);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", diff=",7);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
          }
          *(long *)(_._264_8_ + 0x40) = *(long *)(_._264_8_ + 0x40) + 1;
        }
        sVar5 = sVar5 + 1;
      } while (sVar5 != r.cacheEnd);
    }
  }
  else if (r.cacheEnd != 0) {
    sVar5 = 0;
    do {
      puVar3 = pstack::ReaderArray<unsigned_long,_131072UL>::getitem
                         ((ReaderArray<unsigned_long,_131072UL> *)&stack0xffffffffffeffe70,sVar5);
      ppVar6 = (searchaddrs->
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (searchaddrs->
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar6 != ppVar1) {
        uVar2 = *puVar3;
        do {
          if ((ppVar6->first <= uVar2) && (uVar2 < ppVar6->second)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
            *(uint *)(pstack::Flags::add + *(long *)(std::cout + -0x18)) =
                 *(uint *)(pstack::Flags::add + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
                 *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          }
          ppVar6 = ppVar6 + 1;
        } while (ppVar6 != ppVar1);
      }
      sVar5 = sVar5 + 1;
    } while (sVar5 != r.cacheEnd);
  }
  pstack::IOFlagSave::~IOFlagSave((IOFlagSave *)(r.cache._M_elems + 0x1ffff));
  return;
}

Assistant:

inline void search(
        const Reader::csptr &view,
        const Matcher & m,
        Elf::Addr loc,
        const AddressRanges &searchaddrs,
        SymbolStore &store,
        bool showaddrs) {
    try {
        IOFlagSave _(cout);
        ReaderArray<Word, 131072> r(*view, 0);
        auto start = r.begin();
        if (searchaddrs.size()) {
            for (auto cur = start; cur != r.end(); ++cur) {
                Word p = *cur;
                for (const auto &range : searchaddrs )
                    if (p >= range.first && p < range.second)
                        cout << "0x" << hex << loc + (cur - start) * sizeof( Word) << dec << "\n";
            }
        } else {
            for (auto cur = start; cur != r.end(); ++cur) {
                Word p = *cur;
                if ( auto [ found, sym ] = store.find(p, m); found) {
                    if (showaddrs)
                        cout
                            << sym->name << " 0x" << std::hex << loc + (cur - start) * sizeof(Word)
                            << std::dec <<  " ... size=" << sym->sym.st_size
                            << ", diff=" << p - sym->memaddr() << endl;
#ifdef WITH_PYTHON
                    if (py) {
                        std::cout << "pyo " << Elf::Addr(loc) << " ";
                        py->print(Elf::Addr(loc) - sizeof (PyObject) +
                                sizeof (struct _typeobject *));
                        std::cout << "\n";
                    }
#endif
                    sym->count++;
                }
            }
        }
    } catch (const std::exception &ex) {
        std::clog << "warning: error reading data at " << std::hex << loc << std::dec << ": " << ex.what() << "\n";
    }
}